

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiterable.h
# Opt level: O0

QConstIterator<QMetaAssociation> __thiscall
QIterable<QMetaAssociation>::constEnd(QIterable<QMetaAssociation> *this)

{
  void *extraout_RDX;
  QMetaContainer *in_RSI;
  QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_> in_RDI;
  QConstIterator<QMetaAssociation> QVar1;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffffc8;
  QConstIterator<QMetaAssociation> *this_00;
  QTaggedPointer<QIterable<QMetaAssociation>,_QtPrivate::QConstPreservingPointer<QIterable<QMetaAssociation>,_QIterable<QMetaAssociation>_>::Tag>
  container;
  
  this_00 = (QConstIterator<QMetaAssociation> *)(in_RSI + 2);
  container = in_RDI.m_pointer.d;
  constIterable((QIterable<QMetaAssociation> *)0x33519a);
  QMetaContainer::constEnd(in_RSI,(void *)container.d);
  QConstIterator<QMetaAssociation>::QConstIterator
            (this_00,in_stack_ffffffffffffffc8,(void *)0x3351b9);
  QVar1.super_QBaseIterator<QMetaAssociation>.m_iterator = extraout_RDX;
  QVar1.super_QBaseIterator<QMetaAssociation>.m_iterable.m_pointer.d = in_RDI.m_pointer.d;
  return (QConstIterator<QMetaAssociation>)QVar1.super_QBaseIterator<QMetaAssociation>;
}

Assistant:

QConstIterator<Container> constEnd() const
    {
        return QConstIterator(this, m_metaContainer.constEnd(constIterable()));
    }